

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundImpDirWrapper.cpp
# Opt level: O0

char * __thiscall BoundEntryWrapper::getLibraryName(BoundEntryWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  IMAGE_BOUND_IMPORT_DESCRIPTOR *pIVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  BoundImpDirWrapper *local_60;
  char *ptr;
  WORD mnOff;
  IMAGE_BOUND_IMPORT_DESCRIPTOR *bImp;
  uint64_t offset;
  IMAGE_BOUND_IMPORT_DESCRIPTOR *firstEntry;
  BoundImpDirWrapper *parent;
  BoundEntryWrapper *this_local;
  
  iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0x23])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    local_60 = (BoundImpDirWrapper *)0x0;
  }
  else {
    local_60 = (BoundImpDirWrapper *)
               __dynamic_cast(CONCAT44(extraout_var,iVar2),&ExeNodeWrapper::typeinfo,
                              &BoundImpDirWrapper::typeinfo,0);
  }
  if (local_60 == (BoundImpDirWrapper *)0x0) {
    this_local = (BoundEntryWrapper *)0x0;
  }
  else {
    pIVar4 = BoundImpDirWrapper::boundImp(local_60);
    if (pIVar4 == (IMAGE_BOUND_IMPORT_DESCRIPTOR *)0x0) {
      this_local = (BoundEntryWrapper *)0x0;
    }
    else {
      iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[6])(this,pIVar4,0);
      if (CONCAT44(extraout_var_00,iVar2) == -1) {
        this_local = (BoundEntryWrapper *)0x0;
      }
      else {
        iVar3 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                  _vptr_AbstractByteBuffer[0xc])();
        if (CONCAT44(extraout_var_01,iVar3) == 0) {
          this_local = (BoundEntryWrapper *)0x0;
        }
        else {
          pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
          iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                            (pEVar1,(ulong)*(ushort *)(CONCAT44(extraout_var_01,iVar3) + 4) +
                                    CONCAT44(extraout_var_00,iVar2),1,1,0);
          this_local = (BoundEntryWrapper *)CONCAT44(extraout_var_02,iVar2);
        }
      }
    }
  }
  return (char *)this_local;
}

Assistant:

char* BoundEntryWrapper::getLibraryName()
{
    //----
    BoundImpDirWrapper* parent = dynamic_cast<BoundImpDirWrapper*> (this->getParentNode());
    if (!parent) return NULL;

    IMAGE_BOUND_IMPORT_DESCRIPTOR* firstEntry = parent->boundImp();
    if (firstEntry == NULL) return NULL;

    uint64_t offset = this->getOffset(firstEntry);
    if (offset == INVALID_ADDR) return NULL;
    //----
    IMAGE_BOUND_IMPORT_DESCRIPTOR* bImp = (IMAGE_BOUND_IMPORT_DESCRIPTOR*) this->getPtr();
    if (bImp == NULL) return NULL;

    WORD mnOff = bImp->OffsetModuleName;

    offset += mnOff;

    char *ptr = (char*) m_Exe->getContentAt(offset, Executable::RAW, 1);
    return ptr;
}